

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  size_t sVar3;
  undefined1 auStack_58 [8];
  Location loc;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> field;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_58 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar3 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar3;
  loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  auStack_58 = (undefined1  [8])__s;
  MakeUnique<wabt::TableModuleField,wabt::Location>
            ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_58);
  *(undefined2 *)(loc.field_1._8_8_ + 0x70) = *(undefined2 *)&elem_limits->has_max;
  uVar2 = elem_limits->max;
  *(uint64_t *)(loc.field_1._8_8_ + 0x60) = elem_limits->initial;
  *(uint64_t *)(loc.field_1._8_8_ + 0x68) = uVar2;
  field._M_t.
  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
          )loc.field_1._8_8_;
  loc.field_1._8_8_ = 0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>)
      field._M_t.
      super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>.
      _M_t.
      super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
      .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>)0x0) {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>)0x0;
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}